

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  FmsInt order;
  double dtime;
  int dims [3];
  char filename [100];
  int local_c0 [4];
  char *local_b0;
  double local_a8;
  double local_a0;
  char local_98 [104];
  
  local_c0[0] = 3;
  local_c0[1] = 3;
  local_c0[2] = 3;
  uVar3 = 1;
  order = 1;
  if (argc < 2) {
    local_b0 = "ascii";
  }
  else {
    local_b0 = argv[1];
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      if (iVar1 == 0) {
        return -1;
      }
      order = (FmsInt)iVar1;
      if (5 < (uint)argc) {
        iVar1 = atoi(argv[3]);
        local_c0[0] = iVar1;
        iVar2 = atoi(argv[4]);
        local_c0[1] = iVar2;
        local_c0[2] = atoi(argv[5]);
        if (local_c0[2] < 2 || (iVar2 < 2 || iVar1 < 2)) {
          return -2;
        }
        if ((argc != 6) && (uVar3 = atoi(argv[6]), (int)uVar3 < 1)) {
          return 0;
        }
      }
    }
  }
  local_a0 = 0.0;
  iVar1 = 0x4d2;
  uVar5 = 0;
  do {
    if (uVar3 == 1) {
      builtin_strncpy(local_98,"hex.fms",8);
      dtime = local_a0 + 1.2345678;
    }
    else {
      local_a8 = local_a0 + 1.2345678;
      sprintf(local_98,"hex%04d.fms",uVar5);
      dtime = local_a8;
    }
    WriteTimeStep(local_98,local_b0,local_c0,order,iVar1,dtime);
    local_a0 = local_a0 + 1.0;
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
    iVar1 = iVar1 + 1000;
  } while (uVar3 != uVar4);
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
  int timestep = 0, nts = 1;
  const char *protocol = "ascii";
  char filename[100];
  int dims[3] = {3,3,3};
  FmsInt order = 1;

  /* Handle some command line args. */
  if(argc > 1) {
    protocol = argv[1];
    if(argc > 2) {
      order = atoi(argv[2]);
      if(order < 1)
        return -1;
      if(argc >= 6) {
        dims[0] = atoi(argv[3]);
        dims[1] = atoi(argv[4]);
        dims[2] = atoi(argv[5]);
        if(dims[0] < 2 || dims[1] < 2 || dims[2] < 2)
          return -2;
        if(argc >= 7)
          nts = atoi(argv[6]);
      }
    }
  }

  for(timestep = 0; timestep < nts; timestep++) {
    int cycle  = 1234 + 1000*timestep;
    double dtime = 1.2345678 + timestep;
    if(nts > 1)
      sprintf(filename, "hex%04d.fms", timestep);
    else
      strcpy(filename, "hex.fms");

    WriteTimeStep(filename, protocol, dims, order, cycle, dtime);
  }

  return 0;
}